

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O2

bool __thiscall ManifestParser::ParseDefault(ManifestParser *this,string *err)

{
  Lexer *this_00;
  bool bVar1;
  byte unaff_BPL;
  EvalString eval;
  string path;
  string path_err;
  uint64_t slash_bits;
  
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Parser).lexer_;
  bVar1 = Lexer::ReadPath(this_00,&eval,err);
  if (bVar1) {
    if (eval.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        eval.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path,"expected target name",(allocator<char> *)&path_err);
      unaff_BPL = Lexer::Error(this_00,&path,err);
      std::__cxx11::string::~string((string *)&path);
    }
    else {
      do {
        EvalString::Evaluate_abi_cxx11_(&path,&eval,&this->env_->super_Env);
        path_err._M_dataplus._M_p = (pointer)&path_err.field_2;
        path_err._M_string_length = 0;
        path_err.field_2._M_local_buf[0] = '\0';
        bVar1 = CanonicalizePath(&path,&slash_bits,&path_err);
        if (bVar1) {
          bVar1 = State::AddDefault((this->super_Parser).state_,(StringPiece)path._0_16_,&path_err);
          if (!bVar1) goto LAB_001152e1;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::clear(&eval.parsed_);
          bVar1 = Lexer::ReadPath(this_00,&eval,err);
          unaff_BPL = unaff_BPL & bVar1;
        }
        else {
LAB_001152e1:
          unaff_BPL = Lexer::Error(this_00,&path_err,err);
          bVar1 = false;
        }
        std::__cxx11::string::~string((string *)&path_err);
        std::__cxx11::string::~string((string *)&path);
        if (bVar1 == false) goto LAB_00115365;
      } while (eval.parsed_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               eval.parsed_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      unaff_BPL = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
    }
  }
  else {
    unaff_BPL = false;
  }
LAB_00115365:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&eval.parsed_);
  return (bool)unaff_BPL;
}

Assistant:

bool ManifestParser::ParseDefault(string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  if (eval.empty())
    return lexer_.Error("expected target name", err);

  do {
    string path = eval.Evaluate(env_);
    string path_err;
    uint64_t slash_bits;  // Unused because this only does lookup.
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    if (!state_->AddDefault(path, &path_err))
      return lexer_.Error(path_err, err);

    eval.Clear();
    if (!lexer_.ReadPath(&eval, err))
      return false;
  } while (!eval.empty());

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  return true;
}